

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

QModelIndex * __thiscall QTreeViewPrivate::modelIndex(QTreeViewPrivate *this,int i,int column)

{
  long lVar1;
  int iVar2;
  QList<QTreeViewItem> *this_00;
  qsizetype qVar3;
  const_reference pQVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_ffffffffffffffa8;
  QModelIndex *this_01;
  undefined8 local_20;
  quintptr local_18;
  QAbstractItemModel *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  if (-1 < in_EDX) {
    this_00 = (QList<QTreeViewItem> *)(long)in_EDX;
    qVar3 = QList<QTreeViewItem>::size((QList<QTreeViewItem> *)(in_RSI + 0x5a0));
    if ((long)this_00 < qVar3) {
      *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
      in_RDI->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      (in_RDI->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = QList<QTreeViewItem>::at(this_00,in_stack_ffffffffffffffa8);
      iVar2 = (pQVar4->index).c;
      in_RDI->r = (pQVar4->index).r;
      in_RDI->c = iVar2;
      in_RDI->i = (pQVar4->index).i;
      (in_RDI->m).ptr = (pQVar4->index).m.ptr;
      if (in_ECX != 0) {
        QModelIndex::row(in_RDI);
        QModelIndex::sibling(this_01,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
        in_RDI->r = (undefined4)local_20;
        in_RDI->c = local_20._4_4_;
        in_RDI->i = local_18;
        (in_RDI->m).ptr = local_10;
      }
      goto LAB_008fa295;
    }
  }
  QModelIndex::QModelIndex((QModelIndex *)0x8fa1f0);
LAB_008fa295:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_01;
}

Assistant:

QModelIndex QTreeViewPrivate::modelIndex(int i, int column) const
{
    if (i < 0 || i >= viewItems.size())
        return QModelIndex();

    QModelIndex ret = viewItems.at(i).index;
    if (column)
        ret = ret.sibling(ret.row(), column);
    return ret;
}